

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetInlineQuery(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  self_type *psVar4;
  iterator iVar5;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  path_type *data_00;
  path_type *data_01;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Ptr PVar11;
  path_type local_88;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [24];
  
  data_00 = &local_88;
  data_01 = &local_88;
  puVar3 = (undefined8 *)operator_new(0x90);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_002a5bf0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[0xe] = 0;
  puVar3[0xf] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[0xc] = 0;
  puVar3[0xd] = 0;
  puVar3[0x10] = 0;
  puVar3[0x11] = 0;
  puVar3[2] = puVar3 + 4;
  puVar3[3] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = puVar3 + 0xc;
  puVar3[0xe] = puVar3 + 0x10;
  *(undefined8 **)(this + 8) = puVar3;
  *(string **)this = (string *)(puVar3 + 2);
  paVar1 = &local_88.m_value.field_2;
  local_88.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"id","");
  local_88.m_separator = '.';
  local_88.m_start._M_current = local_88.m_value._M_dataplus._M_p;
  psVar4 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_88);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_58,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar4);
  std::__cxx11::string::operator=((string *)(puVar3 + 2),(string *)&local_58);
  if ((undefined1 *)CONCAT44(uStack_54,local_58) != local_48) {
    operator_delete((undefined1 *)CONCAT44(uStack_54,local_58));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_value._M_dataplus._M_p);
  }
  local_88.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"from","");
  iVar5 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_88.m_value);
  if (iVar5.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
  }
  else {
    parseJsonAndGetUser((TgTypeParser *)&local_58,(ptree *)data_00);
    uVar7 = local_58;
    uVar8 = uStack_54;
    uVar9 = uStack_50;
    uVar10 = uStack_4c;
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[7];
  *(undefined4 *)(puVar3 + 6) = uVar7;
  *(undefined4 *)((long)puVar3 + 0x34) = uVar8;
  *(undefined4 *)(puVar3 + 7) = uVar9;
  *(undefined4 *)((long)puVar3 + 0x3c) = uVar10;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_value._M_dataplus._M_p);
  }
  local_88.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"location","");
  iVar5 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_88.m_value);
  if (iVar5.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    uVar7 = 0;
    uVar8 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
  }
  else {
    parseJsonAndGetLocation((TgTypeParser *)&local_58,(ptree *)data_01);
    uVar7 = local_58;
    uVar8 = uStack_54;
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[9];
  *(undefined4 *)(puVar3 + 8) = uVar7;
  *(undefined4 *)((long)puVar3 + 0x44) = uVar8;
  *(undefined4 *)(puVar3 + 9) = uStack_50;
  *(undefined4 *)((long)puVar3 + 0x4c) = uStack_4c;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_value._M_dataplus._M_p);
  }
  local_88.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"query","");
  local_88.m_separator = '.';
  local_88.m_start._M_current = local_88.m_value._M_dataplus._M_p;
  psVar4 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_88);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_58,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar4);
  std::__cxx11::string::operator=((string *)(puVar3 + 10),(string *)&local_58);
  if ((undefined1 *)CONCAT44(uStack_54,local_58) != local_48) {
    operator_delete((undefined1 *)CONCAT44(uStack_54,local_58));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_value._M_dataplus._M_p);
  }
  local_88.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"offset","");
  local_88.m_separator = '.';
  local_88.m_start._M_current = local_88.m_value._M_dataplus._M_p;
  psVar4 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_88);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_58,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar4);
  std::__cxx11::string::operator=((string *)(puVar3 + 0xe),(string *)&local_58);
  _Var6._M_pi = extraout_RDX;
  if ((undefined1 *)CONCAT44(uStack_54,local_58) != local_48) {
    operator_delete((undefined1 *)CONCAT44(uStack_54,local_58));
    _Var6._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_value._M_dataplus._M_p);
    _Var6._M_pi = extraout_RDX_01;
  }
  PVar11.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  PVar11.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar11.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InlineQuery::Ptr TgTypeParser::parseJsonAndGetInlineQuery(const boost::property_tree::ptree& data) const {
    auto result(make_shared<InlineQuery>());
    result->id = data.get<string>("id");
    result->from = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "from");
    result->location = tryParseJson<Location>(&TgTypeParser::parseJsonAndGetLocation, data, "location");
    result->query = data.get<string>("query");
    result->offset = data.get<string>("offset");

    return result;
}